

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtsStreamReader.cpp
# Opt level: O1

int __thiscall
DTSStreamReader::decodeFrame
          (DTSStreamReader *this,uint8_t *buff,uint8_t *end,int *skipBytes,int *skipBeforeBytes)

{
  byte *pbVar1;
  byte bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  uint32_t *buff_00;
  uint8_t conv_buf [14];
  uint8_t local_3e [14];
  
  this->i_frame_size = 0;
  buff_00 = (uint32_t *)buff;
  if (this->m_isCoreExists != true) {
LAB_00183fce:
    uVar3 = *buff_00;
    uVar4 = my_ntohl(0x64582025);
    if (uVar3 == uVar4) {
      this->m_dts_hd_mode = true;
      iVar5 = decodeHdInfo(this,(uint8_t *)buff_00,end);
      if (iVar5 == -10) {
        return -10;
      }
      if (end <= (uint8_t *)((long)buff_00 + (long)iVar5)) {
        return -10;
      }
      if (this->m_downconvertToDTS != true) {
        this->m_state = stDecodeHD;
        this->m_hdFrameLen = iVar5;
        if (this->m_isCoreExists != false) {
          return this->i_frame_size;
        }
        return iVar5;
      }
      *skipBytes = (int)(uint8_t *)((long)buff_00 + (long)iVar5) - ((int)buff + this->i_frame_size);
    }
    return this->i_frame_size;
  }
  *skipBytes = 0;
  *skipBeforeBytes = 0;
  if ((this->m_state == stDecodeHD) &&
     (uVar3 = *(uint32_t *)buff, uVar4 = my_ntohl(0x64582025), uVar3 == uVar4)) {
    this->m_state = stDecodeHD2;
    return this->m_hdFrameLen;
  }
  this->m_state = stDecodeDTS;
  bVar2 = *buff;
  if (bVar2 < 0xfe) {
    if (bVar2 != 0x1f) {
      return 0;
    }
    if (buff[1] != 0xff) {
      return 0;
    }
    if (buff[2] != 0xe8) {
      return 0;
    }
    if (buff[3] != '\0') {
      return 0;
    }
    if (buff[4] != '\a') {
      return 0;
    }
    if (buff[5] < 0xf0) {
      return 0;
    }
    iVar5 = 0;
  }
  else {
    if (bVar2 == 0xfe) {
      if (buff[1] != '\x7f') {
        return 0;
      }
      if (buff[2] != '\x01') {
        return 0;
      }
      return 0;
    }
    if (bVar2 != 0xff) {
      return 0;
    }
    if (buff[1] != '\x1f') {
      return 0;
    }
    if (buff[2] != '\0') {
      return 0;
    }
    if (buff[3] != 0xe8) {
      return 0;
    }
    if (buff[4] < 0xf0) {
      return 0;
    }
    if (buff[5] != '\a') {
      return 0;
    }
    iVar5 = 1;
  }
  buf14To16(local_3e,buff,0xe,iVar5);
  iVar5 = syncInfo16be(this,local_3e);
  this->i_frame_size = (uint)((ulong)(uint)(iVar5 << 3) * 0x92492493 >> 0x22) & 0xfffffffe;
  uVar11 = this->pi_audio_mode;
  switch(uVar11 & 0xffff) {
  case 0:
    iVar5 = 1;
    break;
  case 1:
    iVar5 = 0x20006;
    break;
  case 2:
  case 3:
  case 4:
    this->pi_channels = '\x02';
    iVar5 = 6;
    break;
  case 5:
    this->pi_channels = '\x03';
    iVar5 = 7;
    break;
  case 6:
    this->pi_channels = '\x03';
    iVar5 = 0x16;
    break;
  case 7:
    this->pi_channels = '\x04';
    iVar5 = 0x17;
    break;
  case 8:
    this->pi_channels = '\x04';
    iVar5 = 0x66;
    break;
  case 9:
    this->pi_channels = '\x05';
    iVar5 = 0x67;
    break;
  case 10:
  case 0xb:
    this->pi_channels = '\x06';
    iVar5 = 0x366;
    break;
  case 0xc:
    this->pi_channels = '\a';
    iVar5 = 0x367;
    break;
  case 0xd:
  case 0xe:
    this->pi_channels = '\b';
    iVar5 = 0x1367;
    break;
  default:
    if (0x3f < (int)uVar11) {
      return 0;
    }
    this->pi_channels = '\0';
    iVar5 = 0;
  }
  this->pi_channels_conf = iVar5;
  if ((uVar11 >> 0x10 & 1) != 0) {
    this->pi_channels = this->pi_channels + '\x01';
    pbVar1 = (byte *)((long)&this->pi_channels_conf + 1);
    *pbVar1 = *pbVar1 | 0x10;
    this->pi_lfeCnt = 1;
  }
  uVar8 = (ulong)this->pi_sample_rate_index;
  if (uVar8 < 0x10) {
    iVar5 = ppi_dts_samplerate[uVar8];
    this->pi_sample_rate = iVar5;
    if ((0x631UL >> (uVar8 & 0x3f) & 1) == 0) {
      if (0x1f < (ulong)this->pi_bit_rate_index) {
        return 0;
      }
      this->pi_bit_rate = ppi_dts_bitrate[this->pi_bit_rate_index];
      iVar6 = this->nblks * 0x20 + 0x20;
      this->pi_frame_length = iVar6;
      this->m_frameDuration = ((double)iVar6 * 5292000000.0) / (double)iVar5;
      uVar11 = this->i_frame_size;
      buff_00 = (uint32_t *)(buff + (int)uVar11);
      if (end + -4 < buff_00) {
        return -10;
      }
      if ((this->m_testMode == true) && (this->m_dtsEsChannels == 0)) {
        uVar9 = (int)end - (int)buff;
        if ((int)uVar11 < (int)uVar9) {
          uVar9 = uVar11;
        }
        if (0x13 < (int)uVar9) {
          uVar7 = 5;
          if (5 < uVar9 >> 2) {
            uVar7 = uVar9 >> 2;
          }
          iVar5 = uVar11 - 0x14;
          lVar10 = 0;
          do {
            if (*(int *)(buff + lVar10 * 4 + 0x10) == 0x5a5a5a5a) {
              uVar11 = (uint)(buff[lVar10 * 4 + 0x15] >> 6);
              if ((iVar5 == uVar11 + (uint)buff[lVar10 * 4 + 0x14] * 4 + -4) ||
                 (iVar5 - (uVar11 + (uint)buff[lVar10 * 4 + 0x14] * 4) == -3)) {
                this->m_dtsEsChannels = buff[lVar10 * 4 + 0x15] >> 2 & 7;
              }
            }
            lVar10 = lVar10 + 1;
            iVar5 = iVar5 + -4;
          } while (uVar7 - 4 != (int)lVar10);
        }
      }
      goto LAB_00183fce;
    }
  }
  return 0;
}

Assistant:

int DTSStreamReader::decodeFrame(uint8_t* buff, uint8_t* end, int& skipBytes, int& skipBeforeBytes)
{
    uint8_t* afterFrameData = buff;
    i_frame_size = 0;
    if (m_isCoreExists)
    {
        skipBeforeBytes = skipBytes = 0;
        if (m_state == DTSDecodeState::stDecodeHD && *reinterpret_cast<uint32_t*>(buff) == my_htonl(DTS_HD_PREFIX))
        {
            m_state = DTSDecodeState::stDecodeHD2;
            return m_hdFrameLen;
        }
        m_state = DTSDecodeState::stDecodeDTS;

        // 14 bits, little endian version of the bitstream
        if (buff[0] == 0xff && buff[1] == 0x1f && buff[2] == 0x00 && buff[3] == 0xe8 && (buff[4] & 0xf0) == 0xf0 &&
            buff[5] == 0x07)
        {
            uint8_t conv_buf[DTS_HEADER_SIZE];
            buf14To16(conv_buf, buff, DTS_HEADER_SIZE, 1);
            i_frame_size = syncInfo16be(conv_buf);
            i_frame_size = i_frame_size * 8 / 14 * 2;
        }
        // 14 bits, big endian version of the bitstream
        else if (buff[0] == 0x1f && buff[1] == 0xff && buff[2] == 0xe8 && buff[3] == 0x00 && buff[4] == 0x07 &&
                 (buff[5] & 0xf0) == 0xf0)
        {
            uint8_t conv_buf[DTS_HEADER_SIZE];
            buf14To16(conv_buf, buff, DTS_HEADER_SIZE, 0);
            i_frame_size = syncInfo16be(conv_buf);
            i_frame_size = i_frame_size * 8 / 14 * 2;
        }
        // 16 bits, big endian version of the bitstream
        else if (buff[0] == 0x7f && buff[1] == 0xfe && buff[2] == 0x80 && buff[3] == 0x01)
        {
            i_frame_size = syncInfo16be(buff);
        }
        // 16 bits, little endian version of the bitstream
        else if (buff[0] == 0xfe && buff[1] == 0x7f && buff[2] == 0x01 && buff[3] == 0x80)
        {
            uint8_t conv_buf[DTS_HEADER_SIZE];
            BufLeToBe(conv_buf, buff, DTS_HEADER_SIZE);
            i_frame_size = syncInfo16be(buff);
        }
        else
            return 0;

        switch (pi_audio_mode & 0xffff)
        {
        case 0x0:
            // Mono
            pi_channels_conf = AOUT_CHAN_CENTER;
            break;
        case 0x1:
            // Dual-mono = stereo + dual-mono
            pi_channels_conf = AOUT_CHAN_LEFT | AOUT_CHAN_RIGHT | AOUT_CHAN_DUALMONO;
            break;
        case 0x2:
        case 0x3:
        case 0x4:
            // Stereo
            pi_channels = 2;
            pi_channels_conf = AOUT_CHAN_LEFT | AOUT_CHAN_RIGHT;
            break;
        case 0x5:
            // 3F
            pi_channels = 3;
            pi_channels_conf = AOUT_CHAN_LEFT | AOUT_CHAN_RIGHT | AOUT_CHAN_CENTER;
            break;
        case 0x6:
            // 2F/1R
            pi_channels = 3;
            pi_channels_conf = AOUT_CHAN_LEFT | AOUT_CHAN_RIGHT | AOUT_CHAN_REARCENTER;
            break;
        case 0x7:
            // 3F/1R
            pi_channels = 4;
            pi_channels_conf = AOUT_CHAN_LEFT | AOUT_CHAN_RIGHT | AOUT_CHAN_CENTER | AOUT_CHAN_REARCENTER;
            break;
        case 0x8:
            // 2F2R
            pi_channels = 4;
            pi_channels_conf = AOUT_CHAN_LEFT | AOUT_CHAN_RIGHT | AOUT_CHAN_REARLEFT | AOUT_CHAN_REARRIGHT;
            break;
        case 0x9:
            // 3F2R
            pi_channels = 5;
            pi_channels_conf =
                AOUT_CHAN_LEFT | AOUT_CHAN_RIGHT | AOUT_CHAN_CENTER | AOUT_CHAN_REARLEFT | AOUT_CHAN_REARRIGHT;
            break;
        case 0xA:
        case 0xB:
            // 2F2M2R
            pi_channels = 6;
            pi_channels_conf = AOUT_CHAN_LEFT | AOUT_CHAN_RIGHT | AOUT_CHAN_MIDDLELEFT | AOUT_CHAN_MIDDLERIGHT |
                               AOUT_CHAN_REARLEFT | AOUT_CHAN_REARRIGHT;
            break;
        case 0xC:
            // 3F2M2R
            pi_channels = 7;
            pi_channels_conf = AOUT_CHAN_LEFT | AOUT_CHAN_RIGHT | AOUT_CHAN_CENTER | AOUT_CHAN_MIDDLELEFT |
                               AOUT_CHAN_MIDDLERIGHT | AOUT_CHAN_REARLEFT | AOUT_CHAN_REARRIGHT;
            break;
        case 0xD:
        case 0xE:
            // 3F2M2R/LFE
            pi_channels = 8;
            pi_channels_conf = AOUT_CHAN_LEFT | AOUT_CHAN_RIGHT | AOUT_CHAN_CENTER | AOUT_CHAN_MIDDLELEFT |
                               AOUT_CHAN_MIDDLERIGHT | AOUT_CHAN_REARLEFT | AOUT_CHAN_REARRIGHT | AOUT_CHAN_LFE;
            break;
        default:
            if (pi_audio_mode <= 63)
            {
                // User defined
                pi_channels = 0;
                pi_channels_conf = 0;
            }
            else
                return 0;
        }

        if (pi_audio_mode & 0x10000)
        {
            (pi_channels)++;
            pi_channels_conf |= AOUT_CHAN_LFE;
            pi_lfeCnt = 1;
        }

        if (pi_sample_rate_index >= std::size(ppi_dts_samplerate))
        {
            return 0;
        }
        pi_sample_rate = ppi_dts_samplerate[pi_sample_rate_index];
        if (!pi_sample_rate)
            return 0;

        if (pi_bit_rate_index >= std::size(ppi_dts_bitrate))
        {
            return 0;
        }
        pi_bit_rate = ppi_dts_bitrate[pi_bit_rate_index];
        if (!pi_bit_rate)
            return 0;

        pi_frame_length = (nblks + 1) * 32;
        m_frameDuration = static_cast<double>(pi_frame_length) * INTERNAL_PTS_FREQ / pi_sample_rate;

        afterFrameData = buff + i_frame_size;
        if (afterFrameData > end - 4)
            return NOT_ENOUGH_BUFFER;

        if (m_testMode && m_dtsEsChannels == 0)
        {
            auto curPtr32 = reinterpret_cast<uint32_t*>(buff + 16);
            const int findSize = FFMIN((int)(end - buff), i_frame_size) / 4 - 4;
            for (int i = 0; i < findSize; ++i)
            {
                if (*curPtr32++ == 0x5a5a5a5a)
                {
                    const auto exHeader = reinterpret_cast<uint8_t*>(curPtr32);
                    const int dataRest = static_cast<int>(buff + i_frame_size - exHeader);
                    const int frameSize = (exHeader[0] << 2) + (exHeader[1] >> 6) - 4;  // remove 4 bytes of ext world
                    if (dataRest - frameSize == 0 || dataRest - frameSize == 1)
                    {
                        m_dtsEsChannels = (static_cast<int>(exHeader[1]) >> 2) & 0x07;
                    }
                }
            }
        }
    }

    if (*reinterpret_cast<uint32_t*>(afterFrameData) == my_htonl(DTS_HD_PREFIX))
    {
        m_dts_hd_mode = true;

        const int hdFrameSize = decodeHdInfo(afterFrameData, end);
        if (hdFrameSize == NOT_ENOUGH_BUFFER)
            return NOT_ENOUGH_BUFFER;

        const uint8_t* nextFrame = afterFrameData + hdFrameSize;
        if (nextFrame >= end)
            return NOT_ENOUGH_BUFFER;
        if (m_downconvertToDTS)
        {
            skipBytes = static_cast<int>(nextFrame - buff - i_frame_size);
            return i_frame_size;
        }
        m_state = DTSDecodeState::stDecodeHD;
        m_hdFrameLen = static_cast<int>(nextFrame - afterFrameData);
        return m_isCoreExists ? i_frame_size : m_hdFrameLen;
    }
    return i_frame_size;
}